

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

bool __thiscall
dxil_spv::CFGNode::can_backtrace_to_with_blockers
          (CFGNode *this,CFGNode *parent,Vector<CFGNode_*> *block_nodes,
          UnorderedSet<const_CFGNode_*> *node_cache)

{
  bool bVar1;
  size_type sVar2;
  reference ppCVar3;
  pair<std::__detail::_Node_iterator<const_dxil_spv::CFGNode_*,_true,_false>,_bool> pVar4;
  CFGNode *p;
  const_iterator __end1;
  const_iterator __begin1;
  Vector<CFGNode_*> *__range1;
  CFGNode *local_70;
  CFGNode **local_68;
  __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  local_60;
  __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  local_58;
  _Node_iterator_base<const_dxil_spv::CFGNode_*,_false> local_50;
  undefined1 local_48;
  CFGNode *local_40;
  CFGNode *local_38;
  unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
  *local_30;
  UnorderedSet<const_CFGNode_*> *node_cache_local;
  Vector<CFGNode_*> *block_nodes_local;
  CFGNode *parent_local;
  CFGNode *this_local;
  
  local_38 = this;
  local_30 = node_cache;
  node_cache_local = (UnorderedSet<const_CFGNode_*> *)block_nodes;
  block_nodes_local = (Vector<CFGNode_*> *)parent;
  parent_local = this;
  sVar2 = std::
          unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
          ::count(node_cache,&local_38);
  if (sVar2 == 0) {
    local_40 = this;
    pVar4 = std::
            unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
            ::insert(local_30,&local_40);
    local_50._M_cur =
         (__node_type *)
         pVar4.first.super__Node_iterator_base<const_dxil_spv::CFGNode_*,_false>._M_cur;
    local_48 = pVar4.second;
    local_60._M_current =
         (CFGNode **)
         std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
         begin((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
               node_cache_local);
    local_68 = (CFGNode **)
               std::
               vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
               end((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    *)node_cache_local);
    local_70 = this;
    local_58 = std::
               find<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode*const*,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,dxil_spv::CFGNode_const*>
                         (local_60,(__normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                    )local_68,&local_70);
    __range1 = (Vector<CFGNode_*> *)
               std::
               vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
               end((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    *)node_cache_local);
    bVar1 = __gnu_cxx::operator!=
                      (&local_58,
                       (__normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                        *)&__range1);
    if (!bVar1) {
      __end1 = std::
               vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
               begin(&this->pred);
      p = (CFGNode *)
          std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
          end(&this->pred);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                         *)&p), bVar1) {
        ppCVar3 = __gnu_cxx::
                  __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                  ::operator*(&__end1);
        if ((*ppCVar3 == (CFGNode *)block_nodes_local) ||
           (bVar1 = can_backtrace_to_with_blockers
                              (*ppCVar3,(CFGNode *)block_nodes_local,
                               (Vector<CFGNode_*> *)node_cache_local,local_30), bVar1)) {
          return true;
        }
        __gnu_cxx::
        __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
        ::operator++(&__end1);
      }
    }
  }
  return false;
}

Assistant:

bool CFGNode::can_backtrace_to_with_blockers(const CFGNode *parent, const Vector<CFGNode *> &block_nodes,
                                             UnorderedSet<const CFGNode *> &node_cache) const
{
	if (node_cache.count(this))
		return false;
	node_cache.insert(this);

	if (std::find(block_nodes.begin(), block_nodes.end(), this) != block_nodes.end())
		return false;

	for (auto *p : pred)
		if (p == parent || p->can_backtrace_to_with_blockers(parent, block_nodes, node_cache))
			return true;

	return false;
}